

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

void Curl_ssl_detach_conn(Curl_easy *data,connectdata *conn)

{
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((Curl_ssl->disassociate_connection != (_func_void_Curl_easy_ptr_int *)0x0) &&
      ((*Curl_ssl->disassociate_connection)(data,0), conn->sock[1] != -1)) &&
     ((*(uint *)&(conn->bits).field_0x4 >> 0x1d & 1) != 0)) {
    (*Curl_ssl->disassociate_connection)(data,1);
  }
  return;
}

Assistant:

void Curl_ssl_detach_conn(struct Curl_easy *data,
                          struct connectdata *conn)
{
  if(Curl_ssl->disassociate_connection) {
    Curl_ssl->disassociate_connection(data, FIRSTSOCKET);
    if((conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) &&
       conn->bits.sock_accepted)
      Curl_ssl->disassociate_connection(data, SECONDARYSOCKET);
  }
}